

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,_ *param_2,Maybe<double> *param_3,
                         undefined8 param_4,CappedArray<char,_24UL> *param_5)

{
  _ *params;
  float *value;
  CappedArray<char,_24UL> local_58;
  String local_38;
  _ *local_20;
  DebugComparison<kj::Maybe<double>,_float> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  tryToCharSequence<kj::Maybe<double>,kj::String>(&local_38,param_2,param_3);
  params = local_20 + 0x18;
  tryToCharSequence<float,kj::CappedArray<char,24ul>>(&local_58,local_20 + 0x10,value);
  concat<kj::String,kj::StringPtr&,kj::CappedArray<char,24ul>>
            (__return_storage_ptr__,(_ *)&local_38,(String *)params,(StringPtr *)&local_58,param_5);
  String::~String(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}